

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O2

int Gia_ManGlaRefine(Gia_Man_t *p,Abc_Cex_t *pCex,int fMinCut,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  Abc_Cex_t *pAVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  Vec_Int_t *pVVar15;
  long lVar16;
  Vec_Int_t *vPis;
  Vec_Int_t *vPPis;
  int local_58;
  int local_54;
  abctime local_50;
  Abc_Cex_t *local_48;
  ulong local_40;
  ulong local_38;
  
  pGVar6 = p;
  aVar5 = Abc_Clock();
  if (p->vGateClasses == (Vec_Int_t *)0x0) {
    Abc_Print((int)pGVar6,"Gia_ManGlaRefine(): Abstraction gate map is missing.\n");
  }
  else {
    pGVar6 = Gia_ManDupAbsGates(p,p->vGateClasses);
    Gia_ManStop(pGVar6);
    pGVar6 = p;
    p_00 = Gia_ManDupAbsGates(p,p->vGateClasses);
    if (p_00->vCis->nSize - p_00->nRegs == pCex->nPis) {
      pGVar6 = p_00;
      local_58 = fMinCut;
      local_54 = fVerbose;
      local_50 = aVar5;
      iVar2 = Gia_ManVerifyCex(p_00,pCex,0);
      if (iVar2 == 0) {
        Abc_Print((int)pGVar6,"Gia_ManGlaRefine(): The initial counter-example is invalid.\n");
      }
      uVar14 = 0;
      Gia_ManGlaCollect(p,p->vGateClasses,&vPis,&vPPis,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0);
      if (vPPis->nSize + vPis->nSize != p_00->vCis->nSize - p_00->nRegs) {
        __assert_fail("Vec_IntSize(vPis) + Vec_IntSize(vPPis) == Gia_ManPiNum(pAbs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                      ,0x7f,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
      }
      *(ulong *)p_00->pObjs = *(ulong *)p_00->pObjs & 0xbfffffffbfffffff | 0x40000000;
      local_48 = pCex;
      do {
        pAVar10 = local_48;
        uVar13 = (ulong)uVar14;
        if (local_48->iFrame < (int)uVar14) {
          iVar2 = 0;
          pGVar7 = Gia_ManPo(p_00,0);
          if (((undefined1  [12])*pGVar7 & (undefined1  [12])0x4000000040000000) ==
              (undefined1  [12])0x4000000000000000) {
            pGVar6 = p;
            pAVar10 = Gia_ManCexRemap(p,pAVar10,vPis);
            Abc_Print((int)pGVar6,
                      "Procedure &gla_refine found a real counter-example in frame %d.\n",
                      (ulong)(uint)pAVar10->iFrame);
            iVar2 = 0;
          }
          else {
            pAVar10 = (Abc_Cex_t *)0x0;
          }
          while ((iVar2 < p_00->nObjs &&
                 (pGVar7 = Gia_ManObj(p_00,iVar2), pGVar7 != (Gia_Obj_t *)0x0))) {
            *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffbfffffff;
            iVar2 = iVar2 + 1;
          }
          if (pAVar10 != (Abc_Cex_t *)0x0) {
            Vec_IntFree(vPis);
            Vec_IntFree(vPPis);
            Gia_ManStop(p_00);
            free(p->pCexSeq);
            p->pCexSeq = pAVar10;
            return 0;
          }
          iVar2 = 0;
          while( true ) {
            iVar3 = local_54;
            if (vPPis->nSize <= iVar2) {
              if (local_54 != 0) {
                pVVar15 = vPPis;
                Abc_Print((int)vPPis,"Additional objects = %d.  ");
                iVar2 = (int)pVVar15;
                aVar5 = Abc_Clock();
                lVar16 = aVar5 - local_50;
                Abc_Print(iVar2,"%s =","Time");
                Abc_Print(iVar2,"%9.2f sec\n",(double)lVar16 / 1000000.0);
              }
              Vec_IntFree(vPis);
              Vec_IntFree(vPPis);
              Gia_ManStop(p_00);
              if (local_58 == 0) {
                return -1;
              }
              Nwk_ManDeriveMinCut(p,iVar3);
              return -1;
            }
            uVar14 = Vec_IntEntry(vPPis,iVar2);
            iVar3 = Vec_IntEntry(p->vGateClasses,uVar14);
            if (iVar3 != 0) {
              __assert_fail("Vec_IntEntry( p->vGateClasses, iObjId ) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                            ,0xac,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
            }
            if (((int)uVar14 < 0) || (p->vGateClasses->nSize <= (int)uVar14)) break;
            p->vGateClasses->pArray[uVar14] = 1;
            iVar2 = iVar2 + 1;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iVar2 = 0;
        while ((iVar2 < p_00->vCis->nSize - p_00->nRegs &&
               (pGVar7 = Gia_ManCi(p_00,iVar2), pGVar7 != (Gia_Obj_t *)0x0))) {
          if (iVar2 < vPis->nSize) {
            uVar12 = pAVar10->nPis * uVar14 + pAVar10->nRegs + iVar2;
            if (((uint)(&pAVar10[1].iPo)[(int)uVar12 >> 5] >> (uVar12 & 0x1f) & 1) == 0) {
              uVar11 = *(ulong *)pGVar7 & 0xbfffffffbfffffff | 0x40000000;
            }
            else {
              uVar11 = (*(ulong *)pGVar7 & 0xbfffffffbfffffff) + 0x4000000000000000;
            }
          }
          else {
            uVar11 = *(ulong *)pGVar7 | 0x4000000040000000;
          }
          *(ulong *)pGVar7 = uVar11;
          iVar2 = iVar2 + 1;
        }
        iVar2 = 0;
        while ((iVar2 < p_00->nRegs &&
               (pGVar7 = Gia_ManCi(p_00,(p_00->vCis->nSize - p_00->nRegs) + iVar2),
               pGVar7 != (Gia_Obj_t *)0x0))) {
          if (uVar14 == 0) {
            uVar11 = *(ulong *)pGVar7 & 0xbfffffffbfffffff | 0x40000000;
          }
          else {
            iVar3 = Gia_ObjIsRo(p_00,pGVar7);
            if (iVar3 == 0) {
              __assert_fail("Gia_ObjIsRo(p, pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar3 = p_00->vCos->nSize;
            iVar1 = p_00->vCis->nSize;
            iVar4 = Gia_ObjCioId(pGVar7);
            pGVar8 = Gia_ManCo(p_00,(iVar3 - iVar1) + iVar4);
            iVar3 = Gia_ObjIsRo(p_00,pGVar7);
            if (iVar3 == 0) {
              __assert_fail("Gia_ObjIsRo(p, pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x355,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
            }
            if ((*(ulong *)pGVar8 & 0x4000000040000000) == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x356,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar9 = *(ulong *)pGVar8 & 0x40000000;
            uVar11 = *(ulong *)pGVar7;
            *(ulong *)pGVar7 = uVar11 & 0xffffffffbfffffff | uVar9;
            uVar11 = uVar11 & 0xbfffffffbfffffff | uVar9 | *(ulong *)pGVar8 & 0x4000000000000000;
          }
          *(ulong *)pGVar7 = uVar11;
          iVar2 = iVar2 + 1;
        }
        iVar2 = 0;
        local_38 = uVar13;
        while ((iVar2 < p_00->nObjs && (pGVar7 = Gia_ManObj(p_00,iVar2), pGVar7 != (Gia_Obj_t *)0x0)
               )) {
          uVar11 = *(ulong *)pGVar7;
          if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
            if (((undefined1  [12])pGVar7[-(uVar11 & 0x1fffffff)] &
                (undefined1  [12])0x4000000040000000) == (undefined1  [12])0x0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar13 = *(ulong *)(pGVar7 + -(ulong)((uint)(uVar11 >> 0x20) & 0x1fffffff)) &
                     0x4000000040000000;
            if (uVar13 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33f,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            iVar3 = Gia_ObjTerSimGet0Fanin0(pGVar7);
            if (iVar3 == 0) {
              uVar9 = 0x4000000000000000;
              if ((uVar11 >> 0x3d & 1) == 0) {
                uVar9 = 0x40000000;
              }
              if (uVar13 == uVar9) goto LAB_004acc62;
              local_40 = 0x4000000000000000;
              iVar3 = Gia_ObjTerSimGet1Fanin0(pGVar7);
              uVar9 = local_40;
              if ((uVar11 >> 0x3d & 1) != 0) {
                uVar9 = 0x40000000;
              }
              if ((uVar13 == uVar9) && (iVar3 != 0)) {
                uVar11 = (uVar11 & 0xbfffffff3fffffff) + 0x4000000000000000;
              }
              else {
                uVar11 = uVar11 | 0x4000000040000000;
              }
            }
            else {
LAB_004acc62:
              uVar11 = uVar11 & 0xbfffffff3fffffff | 0x40000000;
            }
            *(ulong *)pGVar7 = uVar11;
            uVar13 = local_38;
          }
          iVar2 = iVar2 + 1;
        }
        iVar2 = 0;
        while ((iVar2 < p_00->vCos->nSize &&
               (pGVar7 = Gia_ManCo(p_00,iVar2), pGVar7 != (Gia_Obj_t *)0x0))) {
          uVar11 = *(ulong *)pGVar7;
          if ((-1 < (int)(uint)uVar11) || (uVar14 = (uint)uVar11 & 0x1fffffff, uVar14 == 0x1fffffff)
             ) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x349,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          if (((undefined1  [12])pGVar7[-(ulong)uVar14] & (undefined1  [12])0x4000000040000000) ==
              (undefined1  [12])0x0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x34a,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          iVar3 = Gia_ObjTerSimGet0Fanin0(pGVar7);
          if (iVar3 == 0) {
            iVar3 = Gia_ObjTerSimGet1Fanin0(pGVar7);
            if (iVar3 == 0) {
              uVar11 = uVar11 | 0x4000000040000000;
            }
            else {
              uVar11 = (uVar11 & 0xbfffffffbfffffff) + 0x4000000000000000;
            }
          }
          else {
            uVar11 = uVar11 & 0xbfffffffbfffffff | 0x40000000;
          }
          *(ulong *)pGVar7 = uVar11;
          iVar2 = iVar2 + 1;
        }
        uVar14 = (int)uVar13 + 1;
      } while( true );
    }
    Abc_Print((int)pGVar6,"Gia_ManGlaRefine(): The PI counts in GLA and in CEX do not match.\n");
    Gia_ManStop(p_00);
  }
  return -1;
}

Assistant:

int Gia_ManGlaRefine( Gia_Man_t * p, Abc_Cex_t * pCex, int fMinCut, int fVerbose )
{
    extern void Nwk_ManDeriveMinCut( Gia_Man_t * p, int fVerbose );
    int fAddOneLayer = 1;
    Abc_Cex_t * pCexNew = NULL;
    Gia_Man_t * pAbs;
    Aig_Man_t * pAig;
    Abc_Cex_t * pCare;
    Vec_Int_t * vPis, * vPPis;
    int f, i, iObjId;
    abctime clk = Abc_Clock();
    int nOnes = 0, Counter = 0;
    if ( p->vGateClasses == NULL )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): Abstraction gate map is missing.\n" );
        return -1;
    }
    // derive abstraction
    pAbs = Gia_ManDupAbsGates( p, p->vGateClasses );
    Gia_ManStop( pAbs );
    pAbs = Gia_ManDupAbsGates( p, p->vGateClasses );
    if ( Gia_ManPiNum(pAbs) != pCex->nPis )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): The PI counts in GLA and in CEX do not match.\n" );
        Gia_ManStop( pAbs );
        return -1;
    }
    if ( !Gia_ManVerifyCex( pAbs, pCex, 0 ) )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): The initial counter-example is invalid.\n" );
//        Gia_ManStop( pAbs );
//        return -1;
    }
//    else
//        Abc_Print( 1, "Gia_ManGlaRefine(): The initial counter-example is correct.\n" );
    // get inputs
    Gia_ManGlaCollect( p, p->vGateClasses, &vPis, &vPPis, NULL, NULL );
    assert( Vec_IntSize(vPis) + Vec_IntSize(vPPis) == Gia_ManPiNum(pAbs) );
    // add missing logic
    if ( fAddOneLayer )
    {
        Gia_Obj_t * pObj;
        // check if this is a real counter-example
        Gia_ObjTerSimSet0( Gia_ManConst0(pAbs) );
        for ( f = 0; f <= pCex->iFrame; f++ )
        {
            Gia_ManForEachPi( pAbs, pObj, i )
            {
                if ( i >= Vec_IntSize(vPis) ) // PPIs
                    Gia_ObjTerSimSetX( pObj );
                else if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                    Gia_ObjTerSimSet1( pObj );
                else
                    Gia_ObjTerSimSet0( pObj );
            }
            Gia_ManForEachRo( pAbs, pObj, i )
            {
                if ( f == 0 )
                    Gia_ObjTerSimSet0( pObj );
                else
                    Gia_ObjTerSimRo( pAbs, pObj );
            }
            Gia_ManForEachAnd( pAbs, pObj, i )
                Gia_ObjTerSimAnd( pObj );
            Gia_ManForEachCo( pAbs, pObj, i )
                Gia_ObjTerSimCo( pObj );
        }
        pObj = Gia_ManPo( pAbs, 0 );
        if ( Gia_ObjTerSimGet1(pObj) )
        {
            pCexNew = Gia_ManCexRemap( p, pCex, vPis );
            Abc_Print( 1, "Procedure &gla_refine found a real counter-example in frame %d.\n", pCexNew->iFrame );
        }
//        else
//            Abc_Print( 1, "CEX is not real.\n" );
        Gia_ManForEachObj( pAbs, pObj, i )
            Gia_ObjTerSimSetC( pObj );
        if ( pCexNew == NULL )
        {
            // grow one layer
            Vec_IntForEachEntry( vPPis, iObjId, i )
            {
                assert( Vec_IntEntry( p->vGateClasses, iObjId ) == 0 );
                Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );
            }
            if ( fVerbose )
            {
                Abc_Print( 1, "Additional objects = %d.  ", Vec_IntSize(vPPis) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
        }
    }
    else
    {
        // minimize the CEX
        pAig = Gia_ManToAigSimple( pAbs );
        pCare = Saig_ManCbaFindCexCareBits( pAig, pCex, Vec_IntSize(vPis), fVerbose );
        Aig_ManStop( pAig );
        if ( pCare == NULL )
            Abc_Print( 1, "Counter-example minimization has failed.\n" );
        // add new objects to the map
        iObjId = -1;
        for ( f = 0; f <= pCare->iFrame; f++ )
            for ( i = 0; i < pCare->nPis; i++ )
                if ( Abc_InfoHasBit( pCare->pData, pCare->nRegs + f * pCare->nPis + i ) )
                {
                    nOnes++;
                    assert( i >= Vec_IntSize(vPis) );
                    iObjId = Vec_IntEntry( vPPis, i - Vec_IntSize(vPis) );
                    assert( iObjId > 0 && iObjId < Gia_ManObjNum(p) );
                    if ( Vec_IntEntry( p->vGateClasses, iObjId ) > 0 )
                        continue;
                    assert( Vec_IntEntry( p->vGateClasses, iObjId ) == 0 );
                    Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );
    //                Abc_Print( 1, "Adding object %d.\n", iObjId );
    //                Gia_ObjPrint( p, Gia_ManObj(p, iObjId) );
                    Counter++;
                }
        Abc_CexFree( pCare );
        if ( fVerbose )
        {
            Abc_Print( 1, "Essential bits = %d.  Additional objects = %d.  ", nOnes, Counter );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        // consider the case of SAT
        if ( iObjId == -1 )
        {
            pCexNew = Gia_ManCexRemap( p, pCex, vPis );
            Abc_Print( 1, "Procedure &gla_refine found a real counter-example in frame %d.\n", pCexNew->iFrame );
        }
    }
    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Gia_ManStop( pAbs );
    if ( pCexNew )
    {
        ABC_FREE( p->pCexSeq );
        p->pCexSeq = pCexNew;
        return 0;
    }
    // extract abstraction to include min-cut
    if ( fMinCut )
        Nwk_ManDeriveMinCut( p, fVerbose );
    return -1;
}